

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O0

void __thiscall
TPZSkylMatrix<std::complex<double>_>::MultAdd
          (TPZSkylMatrix<std::complex<double>_> *this,TPZFMatrix<std::complex<double>_> *x,
          TPZFMatrix<std::complex<double>_> *y,TPZFMatrix<std::complex<double>_> *z,
          complex<double> alpha,complex<double> beta,int opt)

{
  complex<double> *pcVar1;
  complex<double> beta_00;
  int64_t iVar2;
  int64_t iVar3;
  TPZMatrix<std::complex<double>_> *pTVar4;
  int64_t iVar5;
  int64_t iVar6;
  ostream *poVar7;
  void *this_00;
  complex<double> **ppcVar8;
  TPZFMatrix<std::complex<double>_> *in_RCX;
  TPZBaseMatrix *in_RDX;
  TPZFMatrix<std::complex<double>_> *in_RSI;
  TPZBaseMatrix *in_RDI;
  int in_R8D;
  undefined8 uVar9;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  char *in_stack_00000018;
  char *in_stack_00000020;
  complex<double> *zp;
  complex<double> *diaglast;
  complex<double> *diag;
  complex<double> *p;
  complex<double> val;
  int64_t offset;
  int r;
  int ic;
  int64_t xcols;
  int64_t rows;
  complex<double> *in_stack_fffffffffffffe18;
  ostream *in_stack_fffffffffffffe20;
  ostream *in_stack_fffffffffffffe28;
  TPZSkylMatrix<std::complex<double>_> *in_stack_fffffffffffffe30;
  ostream *in_stack_fffffffffffffe38;
  TPZFMatrix<std::complex<double>_> *in_stack_fffffffffffffe40;
  int opt_00;
  TPZFMatrix<std::complex<double>_> *in_stack_fffffffffffffe70;
  TPZFMatrix<std::complex<double>_> *in_stack_fffffffffffffe78;
  TPZMatrix<std::complex<double>_> *in_stack_fffffffffffffe80;
  int64_t in_stack_fffffffffffffe90;
  complex<double> *local_98;
  complex<double> local_88;
  long local_78;
  int local_70;
  int local_6c;
  long local_68;
  int64_t local_60;
  undefined8 local_58;
  undefined8 local_50;
  int local_44;
  TPZFMatrix<std::complex<double>_> *local_40;
  TPZBaseMatrix *local_38;
  TPZFMatrix<std::complex<double>_> *local_30;
  undefined8 local_20;
  undefined8 local_18;
  
  local_44 = in_R8D;
  local_40 = in_RCX;
  local_38 = in_RDX;
  local_30 = in_RSI;
  local_20 = in_XMM2_Qa;
  local_18 = in_XMM3_Qa;
  if (in_R8D == 0) {
    iVar2 = TPZBaseMatrix::Cols(in_RDI);
    iVar3 = TPZBaseMatrix::Rows((TPZBaseMatrix *)local_30);
    if (iVar2 == iVar3) goto LAB_01379e5a;
LAB_01379e86:
    TPZMatrix<std::complex<double>_>::Error(in_stack_00000020,in_stack_00000018);
  }
  else {
LAB_01379e5a:
    in_stack_fffffffffffffe90 = TPZBaseMatrix::Rows(in_RDI);
    iVar2 = TPZBaseMatrix::Rows((TPZBaseMatrix *)local_30);
    if (in_stack_fffffffffffffe90 != iVar2) goto LAB_01379e86;
  }
  iVar2 = TPZBaseMatrix::Rows((TPZBaseMatrix *)local_40);
  iVar3 = TPZBaseMatrix::Rows((TPZBaseMatrix *)local_30);
  if (iVar2 == iVar3) {
    in_stack_fffffffffffffe80 =
         (TPZMatrix<std::complex<double>_> *)TPZBaseMatrix::Cols((TPZBaseMatrix *)local_40);
    pTVar4 = (TPZMatrix<std::complex<double>_> *)TPZBaseMatrix::Cols((TPZBaseMatrix *)local_30);
    if (in_stack_fffffffffffffe80 != pTVar4) goto LAB_01379ef1;
  }
  else {
LAB_01379ef1:
    in_stack_fffffffffffffe70 = local_40;
    in_stack_fffffffffffffe78 =
         (TPZFMatrix<std::complex<double>_> *)TPZBaseMatrix::Rows((TPZBaseMatrix *)local_30);
    iVar3 = TPZBaseMatrix::Cols((TPZBaseMatrix *)local_30);
    (*(in_stack_fffffffffffffe70->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.
      super_TPZSavable._vptr_TPZSavable[0xe])
              (in_stack_fffffffffffffe70,in_stack_fffffffffffffe78,iVar3);
  }
  iVar3 = TPZBaseMatrix::Cols((TPZBaseMatrix *)local_30);
  iVar5 = TPZBaseMatrix::Cols(local_38);
  if (iVar3 == iVar5) {
    iVar5 = TPZBaseMatrix::Cols((TPZBaseMatrix *)local_30);
    iVar6 = TPZBaseMatrix::Cols((TPZBaseMatrix *)local_40);
    if (iVar5 == iVar6) {
      iVar5 = TPZBaseMatrix::Rows((TPZBaseMatrix *)local_30);
      iVar6 = TPZBaseMatrix::Rows(local_38);
      if (iVar5 == iVar6) {
        iVar5 = TPZBaseMatrix::Rows((TPZBaseMatrix *)local_30);
        iVar6 = TPZBaseMatrix::Rows((TPZBaseMatrix *)local_40);
        opt_00 = (int)((ulong)iVar3 >> 0x20);
        if (iVar5 == iVar6) goto LAB_0137a122;
      }
    }
  }
  opt_00 = (int)((ulong)iVar3 >> 0x20);
  in_stack_fffffffffffffe20 = std::operator<<((ostream *)&std::cout,"x.Cols = ");
  iVar3 = TPZBaseMatrix::Cols((TPZBaseMatrix *)local_30);
  poVar7 = (ostream *)std::ostream::operator<<(in_stack_fffffffffffffe20,iVar3);
  in_stack_fffffffffffffe28 = std::operator<<(poVar7," y.Cols()");
  iVar3 = TPZBaseMatrix::Cols(local_38);
  poVar7 = (ostream *)std::ostream::operator<<(in_stack_fffffffffffffe28,iVar3);
  in_stack_fffffffffffffe30 =
       (TPZSkylMatrix<std::complex<double>_> *)std::operator<<(poVar7," z.Cols() ");
  iVar3 = TPZBaseMatrix::Cols((TPZBaseMatrix *)local_40);
  poVar7 = (ostream *)std::ostream::operator<<(in_stack_fffffffffffffe30,iVar3);
  in_stack_fffffffffffffe38 = std::operator<<(poVar7," x.Rows() ");
  iVar3 = TPZBaseMatrix::Rows((TPZBaseMatrix *)local_30);
  poVar7 = (ostream *)std::ostream::operator<<(in_stack_fffffffffffffe38,iVar3);
  in_stack_fffffffffffffe40 =
       (TPZFMatrix<std::complex<double>_> *)std::operator<<(poVar7," y.Rows() ");
  iVar3 = TPZBaseMatrix::Rows(local_38);
  poVar7 = (ostream *)std::ostream::operator<<(in_stack_fffffffffffffe40,iVar3);
  poVar7 = std::operator<<(poVar7," z.Rows() ");
  iVar3 = TPZBaseMatrix::Rows((TPZBaseMatrix *)local_40);
  this_00 = (void *)std::ostream::operator<<(poVar7,iVar3);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  TPZMatrix<std::complex<double>_>::Error(in_stack_00000020,in_stack_00000018);
LAB_0137a122:
  local_58 = local_20;
  local_50 = local_18;
  beta_00._M_value._8_8_ = in_stack_fffffffffffffe90;
  beta_00._M_value._0_8_ = iVar2;
  TPZMatrix<std::complex<double>_>::PrepareZ
            (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,beta_00,
             opt_00);
  local_60 = TPZBaseMatrix::Rows(in_RDI);
  local_68 = TPZBaseMatrix::Cols((TPZBaseMatrix *)local_30);
  for (local_6c = 0; local_6c < local_68; local_6c = local_6c + 1) {
    for (local_70 = 0; local_70 < local_60; local_70 = local_70 + 1) {
      local_78 = Size(in_stack_fffffffffffffe30,(int64_t)in_stack_fffffffffffffe28);
      uVar9 = 0;
      std::complex<double>::complex(&local_88,0.0,0.0);
      TPZFMatrix<std::complex<double>_>::g(local_30,(local_70 - local_78) + 1,(long)local_6c);
      ppcVar8 = TPZVec<std::complex<double>_*>::operator[]
                          ((TPZVec<std::complex<double>_*> *)(in_RDI + 1),(long)local_70);
      local_98 = *ppcVar8 + local_78;
      ppcVar8 = TPZVec<std::complex<double>_*>::operator[]
                          ((TPZVec<std::complex<double>_*> *)(in_RDI + 1),(long)local_70);
      pcVar1 = *ppcVar8;
      while (local_98 = local_98 + -1, pcVar1 < local_98) {
        if (local_44 == 0) {
          std::conj<double>((complex<double> *)in_stack_fffffffffffffe20);
          std::operator*(in_stack_fffffffffffffe18,(complex<double> *)0x137a350);
          std::complex<double>::operator+=
                    ((complex<double> *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
        }
        else {
          std::operator*(in_stack_fffffffffffffe18,(complex<double> *)0x137a2e4);
          std::complex<double>::operator+=
                    ((complex<double> *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
        }
      }
      if (local_98 == pcVar1) {
        std::operator*(in_stack_fffffffffffffe18,(complex<double> *)0x137a3b7);
        std::complex<double>::operator+=
                  ((complex<double> *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
      }
      std::operator*(in_stack_fffffffffffffe18,(complex<double> *)0x137a3f3);
      TPZFMatrix<std::complex<double>_>::operator()
                (in_stack_fffffffffffffe40,(int64_t)in_stack_fffffffffffffe38,
                 (int64_t)in_stack_fffffffffffffe30);
      std::complex<double>::operator+=
                ((complex<double> *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
      TPZFMatrix<std::complex<double>_>::operator()
                (in_stack_fffffffffffffe40,(int64_t)in_stack_fffffffffffffe38,
                 (int64_t)in_stack_fffffffffffffe30);
      (*(local_30->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
        _vptr_TPZSavable[0x24])(local_30,(long)local_70,(long)local_6c);
      local_88._M_value._8_8_ = uVar9;
      ppcVar8 = TPZVec<std::complex<double>_*>::operator[]
                          ((TPZVec<std::complex<double>_*> *)(in_RDI + 1),(long)local_70);
      local_98 = *ppcVar8 + local_78;
      while (local_98 = local_98 + -1, pcVar1 < local_98) {
        if (local_44 == 0) {
          std::operator*(in_stack_fffffffffffffe18,(complex<double> *)0x137a5c8);
          std::operator*(in_stack_fffffffffffffe18,(complex<double> *)0x137a5ef);
          std::complex<double>::operator+=
                    ((complex<double> *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
        }
        else {
          std::conj<double>((complex<double> *)in_stack_fffffffffffffe20);
          std::operator*(in_stack_fffffffffffffe18,(complex<double> *)0x137a554);
          std::operator*(in_stack_fffffffffffffe18,(complex<double> *)0x137a57b);
          std::complex<double>::operator+=
                    ((complex<double> *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
        }
      }
    }
  }
  return;
}

Assistant:

void TPZSkylMatrix<TVar>::MultAdd(const TPZFMatrix<TVar> &x,const TPZFMatrix<TVar> &y, TPZFMatrix<TVar> &z,
                                  const TVar alpha,const TVar beta ,const int opt) const {
	// Computes z = beta * y + alpha * opt(this)*x
	//          z and x cannot overlap in memory
	
	if (this->fDecomposed != ENoDecompose) {
        //		DebugStop();
	}
	if ((!opt && this->Cols() != x.Rows()) || this->Rows() != x.Rows())
		TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__," <matrixs with incompatible dimensions>" );
	if(z.Rows() != x.Rows() || z.Cols() != x.Cols()) z.Redim(x.Rows(),x.Cols());
	if(x.Cols() != y.Cols() || x.Cols() != z.Cols() || x.Rows() != y.Rows() || x.Rows() != z.Rows()) {
		cout << "x.Cols = " << x.Cols() << " y.Cols()"<< y.Cols() << " z.Cols() " << z.Cols() << " x.Rows() " << x.Rows() << " y.Rows() "<< y.Rows() << " z.Rows() "<< z.Rows() << endl;
		TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__," incompatible dimensions\n");
	}
	this->PrepareZ(y,z,beta,opt);

	const int64_t rows = this->Rows();
	const int64_t xcols = x.Cols();
	for (auto ic = 0; ic < xcols; ic++) {
		for(auto r = 0 ; r < rows ; r++ ) {
			const int64_t offset = Size(r);
			TVar val = 0.;
			const TVar *p = &x.g((r-offset+1),ic);
			TVar *diag = fElem[r] + offset-1;
			const TVar *diaglast = fElem[r];
			while( diag > diaglast ) {
                if constexpr (is_complex<TVar>::value){
                    if(opt) val += *diag-- * *p;
                    else val += std::conj(*diag--) * *p;
                }else{
                    val += *diag-- * *p;
                }
				p ++;
			}
			if( diag == diaglast ) val += *diag * *p;
			z(r,ic) += val*alpha;
			TVar *zp = &z((r-offset+1),ic);
			val = x.GetVal(r,ic);
			diag = fElem[r] + offset-1;
			while( diag > diaglast ) {
                if constexpr (is_complex<TVar>::value){
                    if(opt) *zp += alpha * std::conj(*diag--) * val;
                    else *zp += alpha * *diag-- * val;
                }else{
                    *zp += alpha * *diag-- * val;
                }
                zp ++;
			}
		}
	}
}